

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qformlayout.cpp
# Opt level: O2

void QFormLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<Qt::AlignmentFlag> *pQVar1;
  QFlagsStorage<Qt::AlignmentFlag> QVar2;
  
  if (_c == ResetProperty) {
    switch(_id) {
    case 0:
      *(uint *)(*(long *)(_o + 8) + 0xb0) = *(uint *)(*(long *)(_o + 8) + 0xb0) | 0xff;
      break;
    case 1:
      *(uint *)(*(long *)(_o + 8) + 0xb0) = *(uint *)(*(long *)(_o + 8) + 0xb0) | 0xff00;
      break;
    case 2:
      *(undefined4 *)(*(long *)(_o + 8) + 0xb4) = 0;
      break;
    case 3:
      *(undefined4 *)(*(long *)(_o + 8) + 0xb8) = 0;
    }
  }
  else if (_c == WriteProperty) {
    if ((uint)_id < 6) {
      pQVar1 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
      switch(_id) {
      case 0:
        setFieldGrowthPolicy((QFormLayout *)_o,pQVar1->i);
        return;
      case 1:
        setRowWrapPolicy((QFormLayout *)_o,pQVar1->i);
        return;
      case 2:
        setLabelAlignment((QFormLayout *)_o,(Alignment)pQVar1->i);
        return;
      case 3:
        setFormAlignment((QFormLayout *)_o,(Alignment)pQVar1->i);
        return;
      case 4:
        setHorizontalSpacing((QFormLayout *)_o,pQVar1->i);
        return;
      case 5:
        setVerticalSpacing((QFormLayout *)_o,pQVar1->i);
        return;
      }
    }
  }
  else if ((_c == ReadProperty) && ((uint)_id < 6)) {
    pQVar1 = (QFlagsStorage<Qt::AlignmentFlag> *)*_a;
    switch(_id) {
    case 0:
      QVar2.i = fieldGrowthPolicy((QFormLayout *)_o);
      break;
    case 1:
      QVar2.i = rowWrapPolicy((QFormLayout *)_o);
      break;
    case 2:
      QVar2.i = (Int)labelAlignment((QFormLayout *)_o);
      break;
    case 3:
      QVar2.i = (Int)formAlignment((QFormLayout *)_o);
      break;
    case 4:
      QVar2.i = horizontalSpacing((QFormLayout *)_o);
      break;
    case 5:
      QVar2.i = verticalSpacing((QFormLayout *)_o);
    }
    pQVar1->i = QVar2.i;
  }
  return;
}

Assistant:

void QFormLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFormLayout *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<FieldGrowthPolicy*>(_v) = _t->fieldGrowthPolicy(); break;
        case 1: *reinterpret_cast<RowWrapPolicy*>(_v) = _t->rowWrapPolicy(); break;
        case 2: *reinterpret_cast<Qt::Alignment*>(_v) = _t->labelAlignment(); break;
        case 3: *reinterpret_cast<Qt::Alignment*>(_v) = _t->formAlignment(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->horizontalSpacing(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->verticalSpacing(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setFieldGrowthPolicy(*reinterpret_cast<FieldGrowthPolicy*>(_v)); break;
        case 1: _t->setRowWrapPolicy(*reinterpret_cast<RowWrapPolicy*>(_v)); break;
        case 2: _t->setLabelAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 3: _t->setFormAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 4: _t->setHorizontalSpacing(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setVerticalSpacing(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 0: _t->resetFieldGrowthPolicy(); break;
        case 1: _t->resetRowWrapPolicy(); break;
        case 2: _t->resetLabelAlignment(); break;
        case 3: _t->resetFormAlignment(); break;
        default: break;
        }
    }
}